

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O2

void sb_bmp_change_begin(superblock *sb)

{
  pthread_spin_lock(&sb->bmp_lock);
  atomic_incr_uint64_t(&sb->bmp_wcount,memory_order_seq_cst);
  do {
  } while ((sb->bmp_rcount).super___atomic_base<unsigned_long>._M_i != 0);
  return;
}

Assistant:

static void sb_bmp_change_begin(struct superblock *sb)
{
    // grab lock and increase writer count
    // now new readers cannot increase the reader count
    // (note that there is always one bitmap writer at a time)
    spin_lock(&sb->bmp_lock);
    atomic_incr_uint64_t(&sb->bmp_wcount);

    // wait until previous BMP readers terminate
    // (they are very short bitmap accessing routines so that
    //  will not take long time).
    size_t spin = 0;
    while (atomic_get_uint64_t(&sb->bmp_rcount)) {
       if (++spin > 64) {
#ifdef HAVE_SCHED_H
            sched_yield();
#elif _MSC_VER
            SwitchToThread();
#endif
       }
    }

    // now 1) all previous readers terminated
    //     2) new readers will be blocked
}